

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O2

string * __thiscall
absl::CEscape_abi_cxx11_(string *__return_storage_ptr__,absl *this,string_view src)

{
  absl aVar1;
  absl *paVar2;
  absl *paVar3;
  ulong uVar4;
  absl *paVar5;
  bool bVar6;
  allocator<char> local_61;
  allocator<char> local_60 [32];
  string death_message;
  
  uVar4 = src._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  paVar2 = (absl *)0x3fffffffffffffff;
  if (this < (absl *)0x3fffffffffffffff) {
    paVar2 = this;
  }
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar5 = (absl *)0x0;
  for (paVar3 = (absl *)0x0; paVar2 != paVar3; paVar3 = paVar3 + 1) {
    paVar5 = paVar5 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)paVar3[uVar4]];
  }
  for (; this != paVar2; paVar2 = paVar2 + 1) {
    bVar6 = CARRY8((ulong)paVar5,
                   (ulong)(byte)(anonymous_namespace)::kCEscapedLen[(byte)paVar2[uVar4]]);
    paVar5 = paVar5 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)paVar2[uVar4]];
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&death_message,
                 "Check escaped_len <= std::numeric_limits<size_t>::max() - char_len failed: ",
                 local_60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_60,"escaped_len overflow",&local_61);
      std::__cxx11::string::append((string *)&death_message);
      std::__cxx11::string::~string((string *)local_60);
      (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                (3,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                 ,0x19a,&death_message);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                    ,0x19a,"size_t absl::(anonymous namespace)::CEscapedLength(absl::string_view)");
    }
  }
  if (paVar5 == this) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,uVar4);
  }
  else {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    paVar2 = (absl *)(__return_storage_ptr__->_M_dataplus)._M_p;
    for (paVar3 = (absl *)0x0; this != paVar3; paVar3 = paVar3 + 1) {
      aVar1 = paVar3[uVar4];
      if ((anonymous_namespace)::kCEscapedLen[(byte)aVar1] == '\x02') {
        if (aVar1 == (absl)0x9) {
          *(undefined2 *)paVar2 = 0x745c;
        }
        else if (aVar1 == (absl)0x5c) {
          *(undefined2 *)paVar2 = 0x5c5c;
        }
        else if (aVar1 == (absl)0xd) {
          *(undefined2 *)paVar2 = 0x725c;
        }
        else if (aVar1 == (absl)0x22) {
          *(undefined2 *)paVar2 = 0x225c;
        }
        else if (aVar1 == (absl)0x27) {
          *(undefined2 *)paVar2 = 0x275c;
        }
        else {
          if (aVar1 != (absl)0xa) goto LAB_0024dd94;
          *(undefined2 *)paVar2 = 0x6e5c;
        }
        paVar2 = paVar2 + 2;
      }
      else if ((anonymous_namespace)::kCEscapedLen[(byte)aVar1] == '\x01') {
        *paVar2 = aVar1;
        paVar2 = paVar2 + 1;
      }
      else {
        *paVar2 = (absl)0x5c;
        paVar2[1] = (absl)((byte)aVar1 >> 6 | 0x30);
        paVar2[2] = (absl)((byte)aVar1 >> 3 & 7 | 0x30);
        paVar2[3] = (absl)((byte)aVar1 & 7 | 0x30);
        paVar2 = paVar2 + 4;
      }
LAB_0024dd94:
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(absl::string_view src) {
  std::string dest;
  CEscapeAndAppendInternal(src, &dest);
  return dest;
}